

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_generator.hpp
# Opt level: O0

uuid __thiscall
boost::uuids::
basic_random_generator<boost::random::mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>_>
::operator()(basic_random_generator<boost::random::mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>_>
             *this)

{
  variate_generator<boost::random::mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>_*,_boost::uniform_int<unsigned_long>_>
  *pvVar1;
  iterator puVar2;
  iterator it;
  unsigned_long random_value;
  int i;
  uuid u;
  variate_generator<boost::random::mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>_*,_boost::uniform_int<unsigned_long>_>
  *in_stack_ffffffffffffffc0;
  variate_generator<boost::random::mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>_*,_boost::uniform_int<unsigned_long>_>
  *this_00;
  variate_generator<boost::random::mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>_*,_boost::uniform_int<unsigned_long>_>
  *local_30;
  result_type local_28;
  int local_1c;
  uuid local_10;
  
  local_1c = 0;
  local_28 = random::
             variate_generator<boost::random::mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>_*,_boost::uniform_int<unsigned_long>_>
             ::operator()(in_stack_ffffffffffffffc0);
  local_30 = (variate_generator<boost::random::mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>_*,_boost::uniform_int<unsigned_long>_>
              *)uuid::begin(&local_10);
  while( true ) {
    this_00 = local_30;
    pvVar1 = (variate_generator<boost::random::mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>_*,_boost::uniform_int<unsigned_long>_>
              *)uuid::end((uuid *)local_30);
    if (this_00 == pvVar1) break;
    if (local_1c == 8) {
      local_28 = random::
                 variate_generator<boost::random::mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>_*,_boost::uniform_int<unsigned_long>_>
                 ::operator()(this_00);
      local_1c = 0;
    }
    *(char *)&local_30->_eng = (char)(local_28 >> ((byte)(local_1c << 3) & 0x3f));
    local_30 = (variate_generator<boost::random::mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>_*,_boost::uniform_int<unsigned_long>_>
                *)((long)&local_30->_eng + 1);
    local_1c = local_1c + 1;
  }
  puVar2 = uuid::begin(&local_10);
  puVar2[8] = puVar2[8] & 0xbf;
  puVar2 = uuid::begin(&local_10);
  puVar2[8] = puVar2[8] | 0x80;
  puVar2 = uuid::begin(&local_10);
  puVar2[6] = puVar2[6] & 0x4f;
  puVar2 = uuid::begin(&local_10);
  puVar2[6] = puVar2[6] | 0x40;
  return (uuid)local_10.data;
}

Assistant:

uuid operator()()
    {
        uuid u;

        int i=0;
        unsigned long random_value = generator();
        for (uuid::iterator it=u.begin(); it!=u.end(); ++it, ++i) {
            if (i==sizeof(unsigned long)) {
                random_value = generator();
                i = 0;
            }

            // static_cast gets rid of warnings of converting unsigned long to boost::uint8_t
            *it = static_cast<uuid::value_type>((random_value >> (i*8)) & 0xFF);
        }

        // set variant
        // must be 0b10xxxxxx
        *(u.begin()+8) &= 0xBF;
        *(u.begin()+8) |= 0x80;

        // set version
        // must be 0b0100xxxx
        *(u.begin()+6) &= 0x4F; //0b01001111
        *(u.begin()+6) |= 0x40; //0b01000000

        return u;
    }